

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thumb_instr.c
# Opt level: O0

thumb_instr_type_t get_thumb_instr_type_hash(uint16_t hash)

{
  byte bVar1;
  bool bVar2;
  uint8_t opcode;
  _Bool h2;
  _Bool h1;
  uint16_t hash_local;
  undefined4 local_4;
  
  if ((hash & 0x3e0) == 0x60) {
    local_4 = ADD_SUBTRACT;
  }
  else if ((hash & 0x380) == 0) {
    local_4 = MOVE_SHIFTED_REGISTER;
  }
  else if ((hash & 0x380) == 0x80) {
    local_4 = IMMEDIATE_OPERATIONS;
  }
  else if ((hash & 0x3f0) == 0x100) {
    local_4 = ALU_OPERATIONS;
  }
  else if ((hash & 0x3f0) == 0x110) {
    bVar2 = ((int)(uint)hash >> 1 & 1U) != 0;
    bVar1 = (byte)((int)(uint)hash >> 2) & 3;
    if (((bVar1 == 3) || (bVar2)) || ((hash & 1) != 0)) {
      if ((bVar1 == 3) && (bVar2)) {
        local_4 = THUMB_UNDEFINED;
      }
      else {
        local_4 = HIGH_REGISTER_OPERATIONS;
      }
    }
    else {
      local_4 = THUMB_UNDEFINED;
    }
  }
  else if ((hash & 0x3e0) == 0x120) {
    local_4 = PC_RELATIVE_LOAD;
  }
  else if ((hash & 0x3c8) == 0x140) {
    local_4 = LOAD_STORE_RO;
  }
  else if ((hash & 0x3c8) == 0x148) {
    local_4 = LOAD_STORE_BYTE_HALFWORD;
  }
  else if ((hash & 0x380) == 0x180) {
    local_4 = LOAD_STORE_IO;
  }
  else if ((hash & 0x3c0) == 0x200) {
    local_4 = LOAD_STORE_HALFWORD;
  }
  else if ((hash & 0x3c0) == 0x240) {
    local_4 = SP_RELATIVE_LOAD_STORE;
  }
  else if ((hash & 0x3c0) == 0x280) {
    local_4 = LOAD_ADDRESS;
  }
  else if ((hash & 0x3fc) == 0x2c0) {
    local_4 = ADD_OFFSET_TO_STACK_POINTER;
  }
  else if ((hash & 0x3d8) == 0x2d0) {
    local_4 = PUSH_POP_REGISTERS;
  }
  else if ((hash & 0x3c0) == 0x300) {
    local_4 = MULTIPLE_LOAD_STORE;
  }
  else if ((hash & 0x3fc) == 0x37c) {
    local_4 = THUMB_SOFTWARE_INTERRUPT;
  }
  else if ((hash & 0x3c0) == 0x340) {
    if (((int)(uint)hash >> 3 & 7U) == 7) {
      local_4 = THUMB_UNDEFINED;
    }
    else {
      local_4 = CONDITIONAL_BRANCH;
    }
  }
  else if ((hash & 0x3e0) == 0x380) {
    local_4 = UNCONDITIONAL_BRANCH;
  }
  else if ((hash & 0x3c0) == 0x3c0) {
    local_4 = LONG_BRANCH_LINK;
  }
  else {
    local_4 = THUMB_UNDEFINED;
  }
  return local_4;
}

Assistant:

thumb_instr_type_t get_thumb_instr_type_hash(half hash) {
    if ((hash & 0b1111100000u) == 0b0001100000u) {
        return ADD_SUBTRACT;
    }
    if ((hash & 0b1110000000u) == 0b0000000000u) {
        return MOVE_SHIFTED_REGISTER;
    }
    if ((hash & 0b1110000000u) == 0b0010000000u) {
        return IMMEDIATE_OPERATIONS;
    }
    if ((hash & 0b1111110000u) == 0b0100000000u) {
        return ALU_OPERATIONS;
    }
    if ((hash & 0b1111110000u) == 0b0100010000u) {
        bool h1 = (hash >> 1u) & 1u;
        bool h2 = hash & 1u;
        byte opcode = (hash >> 2u) & 0b11u;

        if (opcode != 0b11 && h1 == 0 && h2 == 0) return THUMB_UNDEFINED;
        if (opcode == 0b11 && h1 == 1) return THUMB_UNDEFINED;

        return HIGH_REGISTER_OPERATIONS;
    }
    if ((hash & 0b1111100000u) == 0b0100100000u) return PC_RELATIVE_LOAD;
    if ((hash & 0b1111001000u) == 0b0101000000u) return LOAD_STORE_RO;
    if ((hash & 0b1111001000u) == 0b0101001000u) return LOAD_STORE_BYTE_HALFWORD;
    if ((hash & 0b1110000000u) == 0b0110000000u) return LOAD_STORE_IO;
    if ((hash & 0b1111000000u) == 0b1000000000u) return LOAD_STORE_HALFWORD;
    if ((hash & 0b1111000000u) == 0b1001000000u) return SP_RELATIVE_LOAD_STORE;
    if ((hash & 0b1111000000u) == 0b1010000000u) return LOAD_ADDRESS;
    if ((hash & 0b1111111100u) == 0b1011000000u) return ADD_OFFSET_TO_STACK_POINTER;
    if ((hash & 0b1111011000u) == 0b1011010000u) return PUSH_POP_REGISTERS;
    if ((hash & 0b1111000000u) == 0b1100000000u) return MULTIPLE_LOAD_STORE;
    if ((hash & 0b1111111100u) == 0b1101111100u) return THUMB_SOFTWARE_INTERRUPT;
    if ((hash & 0b1111000000u) == 0b1101000000u) {
        if (((hash >> 3u) & 0b111u) == 0b111u) {
            return THUMB_UNDEFINED;
        }

        return CONDITIONAL_BRANCH;
    }
    if ((hash & 0b1111100000u) == 0b1110000000u) return UNCONDITIONAL_BRANCH;
    if ((hash & 0b1111000000u) == 0b1111000000u) return LONG_BRANCH_LINK;

    return THUMB_UNDEFINED;
}